

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5AsciiTokenize(Fts5Tokenizer *pTokenizer,void *pCtx,int iUnused,char *pText,int nText,
                     _func_int_void_ptr_int_char_ptr_int_int_int *xToken)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  char *p;
  ulong uVar8;
  byte bVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  long in_FS_OFFSET;
  int local_b0;
  char aFold [64];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  p = aFold;
  aFold._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  aFold._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
  aFold._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  aFold._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  aFold._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  aFold._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  aFold._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  aFold._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b0 = 0x40;
  iVar5 = 0;
  iVar6 = 0;
  while( true ) {
    if ((nText <= iVar6) || (iVar5 != 0)) break;
    iVar12 = iVar6 + 2;
    iVar14 = -iVar6;
    lVar7 = 0;
    iVar10 = iVar6;
    while( true ) {
      iVar5 = 0;
      if ((long)nText - (long)iVar6 == lVar7) goto LAB_001d5991;
      if (((long)pText[lVar7 + iVar6] < 0) ||
         (pTokenizer[pText[lVar7 + iVar6]] != (Fts5Tokenizer)0x0)) break;
      lVar7 = lVar7 + 1;
      iVar12 = iVar12 + 1;
      iVar10 = iVar10 + 1;
      iVar14 = iVar14 + -1;
    }
    iVar4 = (int)lVar7;
    if (nText - iVar6 == iVar4) break;
    uVar13 = iVar6 + iVar4 + 1;
    if ((int)uVar13 < nText) {
      uVar13 = nText;
    }
    lVar11 = (long)iVar10;
    while (lVar11 = lVar11 + 1, lVar11 < nText) {
      if ((-1 < (long)pText[lVar11]) && (pTokenizer[pText[lVar11]] == (Fts5Tokenizer)0x0)) {
        uVar13 = iVar12 - 1;
        break;
      }
      iVar12 = iVar12 + 1;
    }
    uVar8 = ((ulong)(uint)-iVar6 + (ulong)uVar13) - lVar7;
    iVar5 = (int)uVar8;
    if (local_b0 < iVar5) {
      if (p != aFold) {
        sqlite3_free(p);
      }
      p = (char *)sqlite3_malloc64((uVar8 & 0xffffffff) * 2);
      if (p == (char *)0x0) {
        p = (char *)0x0;
        iVar5 = 7;
        goto LAB_001d599b;
      }
      local_b0 = iVar5 * 2;
    }
    uVar3 = iVar14 + uVar13;
    if ((int)(iVar14 + uVar13) < 1) {
      uVar3 = 0;
    }
    for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
      bVar1 = pText[uVar8 + (long)iVar10];
      bVar9 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar9 = bVar1;
      }
      p[uVar8] = bVar9;
    }
    iVar5 = (*xToken)(pCtx,0,p,iVar5,iVar6 + iVar4,uVar13);
    iVar6 = iVar12;
  }
LAB_001d5991:
  if (p != aFold) {
LAB_001d599b:
    sqlite3_free(p);
  }
  iVar6 = 0;
  if (iVar5 != 0x65) {
    iVar6 = iVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return iVar6;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5AsciiTokenize(
  Fts5Tokenizer *pTokenizer,
  void *pCtx,
  int iUnused,
  const char *pText, int nText,
  int (*xToken)(void*, int, const char*, int nToken, int iStart, int iEnd)
){
  AsciiTokenizer *p = (AsciiTokenizer*)pTokenizer;
  int rc = SQLITE_OK;
  int ie;
  int is = 0;

  char aFold[64];
  int nFold = sizeof(aFold);
  char *pFold = aFold;
  unsigned char *a = p->aTokenChar;

  UNUSED_PARAM(iUnused);

  while( is<nText && rc==SQLITE_OK ){
    int nByte;

    /* Skip any leading divider characters. */
    while( is<nText && ((pText[is]&0x80)==0 && a[(int)pText[is]]==0) ){
      is++;
    }
    if( is==nText ) break;

    /* Count the token characters */
    ie = is+1;
    while( ie<nText && ((pText[ie]&0x80) || a[(int)pText[ie]] ) ){
      ie++;
    }

    /* Fold to lower case */
    nByte = ie-is;
    if( nByte>nFold ){
      if( pFold!=aFold ) sqlite3_free(pFold);
      pFold = sqlite3_malloc64((sqlite3_int64)nByte*2);
      if( pFold==0 ){
        rc = SQLITE_NOMEM;
        break;
      }
      nFold = nByte*2;
    }
    asciiFold(pFold, &pText[is], nByte);

    /* Invoke the token callback */
    rc = xToken(pCtx, 0, pFold, nByte, is, ie);
    is = ie+1;
  }

  if( pFold!=aFold ) sqlite3_free(pFold);
  if( rc==SQLITE_DONE ) rc = SQLITE_OK;
  return rc;
}